

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

void __thiscall sf::priv::WindowImplX11::resetVideoMode(WindowImplX11 *this)

{
  Display *pDVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  RROutput output;
  int xRandRMinor;
  int xRandRMajor;
  
  if ((anonymous_namespace)::fullscreenWindow != this) {
    return;
  }
  bVar2 = checkXRandR(this,&xRandRMajor,&xRandRMinor);
  if (!bVar2) {
    (anonymous_namespace)::fullscreenWindow = (WindowImplX11 *)0x0;
    return;
  }
  pDVar1 = this->m_display;
  lVar3 = XRRGetScreenResources
                    (pDVar1,*(undefined8 *)
                             (*(long *)(pDVar1 + 0xe8) + 0x10 + (long)*(int *)(pDVar1 + 0xe0) * 0x80
                             ));
  if (lVar3 == 0) {
    poVar5 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Failed to get the current screen resources to reset the video mode",0x42);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    return;
  }
  lVar4 = XRRGetCrtcInfo(this->m_display,lVar3,this->m_oldRRCrtc);
  if (lVar4 == 0) {
    XRRFreeScreenResources(lVar3);
    poVar5 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Failed to get crtc info to reset the video mode",0x2f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    goto LAB_00143601;
  }
  if ((xRandRMajor < 2) && (xRandRMajor != 1 || xRandRMinor < 3)) {
LAB_00143517:
    output = **(RROutput **)(lVar3 + 0x28);
  }
  else {
    pDVar1 = this->m_display;
    output = XRRGetOutputPrimary(pDVar1,*(undefined8 *)
                                         (*(long *)(pDVar1 + 0xe8) + 0x10 +
                                         (long)*(int *)(pDVar1 + 0xe0) * 0x80));
    if (output == 0) goto LAB_00143517;
  }
  XRRSetCrtcConfig(this->m_display,lVar3,this->m_oldRRCrtc,0,*(undefined4 *)(lVar4 + 8),
                   *(undefined4 *)(lVar4 + 0xc),(long)this->m_oldVideoMode,
                   *(undefined2 *)(lVar4 + 0x20),&output,1);
  XRRFreeCrtcInfo(lVar4);
  XRRFreeScreenResources(lVar3);
LAB_00143601:
  if (lVar4 != 0) {
    (anonymous_namespace)::fullscreenWindow = (WindowImplX11 *)0x0;
    return;
  }
  return;
}

Assistant:

void WindowImplX11::resetVideoMode()
{
    if (fullscreenWindow == this)
    {
        // Try to set old configuration
        // Check if the XRandR extension
        int xRandRMajor, xRandRMinor;
        if (checkXRandR(xRandRMajor, xRandRMinor))
        {
            XRRScreenResources* res = XRRGetScreenResources(m_display, DefaultRootWindow(m_display));
            if (!res)
            {
                err() << "Failed to get the current screen resources to reset the video mode" << std::endl;
                return;
            }

            // Retreive current screen position and rotation
            XRRCrtcInfo* crtcInfo = XRRGetCrtcInfo(m_display, res, m_oldRRCrtc);
            if (!crtcInfo)
            {
                XRRFreeScreenResources(res);
                err() << "Failed to get crtc info to reset the video mode" << std::endl;
                return;
            }

            RROutput output;

            // if version >= 1.3 get the primary screen else take the first screen
            if ((xRandRMajor == 1 && xRandRMinor >= 3) || xRandRMajor > 1)
            {
                output = XRRGetOutputPrimary(m_display, DefaultRootWindow(m_display));

                // Check if returned output is valid, otherwise use the first screen
                if (output == None)
                    output = res->outputs[0];
            }
            else{
                output = res->outputs[0];
            }

            XRRSetCrtcConfig(m_display,
                             res,
                             m_oldRRCrtc,
                             CurrentTime,
                             crtcInfo->x,
                             crtcInfo->y,
                             m_oldVideoMode,
                             crtcInfo->rotation,
                             &output,
                             1);

            XRRFreeCrtcInfo(crtcInfo);
            XRRFreeScreenResources(res);
        }

        // Reset the fullscreen window
        fullscreenWindow = NULL;
    }
}